

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesImpl<true,true,true>
          (BeagleCPU4StateSSEImpl<double,2,0> *this,double *outDerivatives,double *outSumDerivatives
          ,double *outSumSquaredDerivatives)

{
  double *pdVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  int k;
  long lVar8;
  double dVar9;
  double dVar11;
  undefined1 auVar10 [16];
  double dVar12;
  double dVar14;
  undefined1 auVar13 [16];
  double dVar15;
  double dVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  
  dVar9 = 0.0;
  dVar11 = 0.0;
  dVar12 = 0.0;
  dVar14 = 0.0;
  for (lVar8 = 0; iVar2 = *(int *)(this + 0x14), lVar8 < (long)iVar2 + -1; lVar8 = lVar8 + 2) {
    auVar13 = vdivpd_avx(*(undefined1 (*) [16])(*(long *)(this + 0x100) + lVar8 * 8),
                         *(undefined1 (*) [16])(*(long *)(this + 0xf8) + lVar8 * 8));
    pdVar1 = (double *)(*(long *)(this + 0x80) + lVar8 * 8);
    dVar6 = *pdVar1;
    dVar7 = pdVar1[1];
    *(undefined1 (*) [16])(outDerivatives + lVar8) = auVar13;
    dVar15 = auVar13._0_8_;
    dVar18 = auVar13._8_8_;
    dVar12 = dVar12 + dVar15 * dVar6;
    dVar14 = dVar14 + dVar18 * dVar7;
    dVar9 = dVar9 + dVar15 * dVar15 * dVar6;
    dVar11 = dVar11 + dVar18 * dVar18 * dVar7;
  }
  lVar3 = *(long *)(this + 0x100);
  lVar4 = *(long *)(this + 0x80);
  lVar5 = *(long *)(this + 0xf8);
  auVar13._0_8_ = dVar12 + dVar14;
  auVar13._8_8_ = dVar12 + dVar14;
  auVar10._0_8_ = dVar9 + dVar11;
  auVar10._8_8_ = dVar9 + dVar11;
  while (lVar8 < iVar2) {
    auVar16._0_8_ = *(double *)(lVar3 + lVar8 * 8) / *(double *)(lVar5 + lVar8 * 8);
    auVar16._8_8_ = 0;
    outDerivatives[lVar8] = auVar16._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)(lVar4 + lVar8 * 8);
    lVar8 = lVar8 + 1;
    auVar13 = vfmadd231sd_fma(auVar13,auVar16,auVar19);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = auVar16._0_8_ * auVar16._0_8_;
    auVar10 = vfmadd231sd_fma(auVar10,auVar19,auVar17);
  }
  *outSumDerivatives = auVar13._0_8_;
  *outSumSquaredDerivatives = auVar10._0_8_;
  return;
}

Assistant:

void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    V_Real vSum = VEC_SETZERO();
    V_Real vSumSquared = VEC_SETZERO();

    int k = 0;
    for (; k < kPatternCount - 1; k += 2) {

        V_Real numerator = VEC_LOAD(grandNumeratorDerivTmp + k);
        V_Real denominator = VEC_LOAD(grandDenominatorDerivTmp + k);
        V_Real derivative = VEC_DIV(numerator, denominator);
        V_Real patternWeight = VEC_LOAD(gPatternWeights + k);

        if (DoDerivatives) {
            VEC_STOREU(outDerivatives + k, derivative);
        }

        if (DoSum) {
            vSum = VEC_MADD(derivative, patternWeight, vSum);
        }

        if (DoSumSquared) {
            derivative = VEC_MULT(derivative, derivative);
            vSumSquared = VEC_MADD(derivative, patternWeight, vSumSquared);
        }
    }

    double sum;
    double sumSquared;

    if (DoSum) {
        sum = _mm_cvtsd_f64(VEC_ADD(vSum, VEC_SWAP(vSum)));
    }

    if (DoSumSquared) {
        sumSquared = _mm_cvtsd_f64(VEC_ADD(vSumSquared, VEC_SWAP(vSumSquared)));
    }

    for (; k < kPatternCount; ++k) {
        double derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) {
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}